

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall
icu_63::UnifiedCache::_put
          (UnifiedCache *this,UHashElement *element,SharedObject *value,UErrorCode status)

{
  CacheKeyBase *theKey_00;
  SharedObject *value_00;
  UHashElement *ptr;
  SharedObject *oldValue;
  CacheKeyBase *theKey;
  UErrorCode status_local;
  SharedObject *value_local;
  UHashElement *element_local;
  UnifiedCache *this_local;
  
  theKey_00 = (CacheKeyBase *)(element->key).pointer;
  value_00 = (SharedObject *)(element->value).pointer;
  theKey_00->fCreationStatus = status;
  if (value->softRefCount == 0) {
    _registerMaster(this,theKey_00,value);
  }
  value->softRefCount = value->softRefCount + 1;
  (element->value).pointer = value;
  removeSoftRef(this,value_00);
  umtx_condBroadcast_63(&gInProgressValueAddedCond);
  return;
}

Assistant:

void UnifiedCache::_put(
        const UHashElement *element,
        const SharedObject *value,
        const UErrorCode status) const {
    U_ASSERT(_inProgress(element));
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    const SharedObject *oldValue = (const SharedObject *) element->value.pointer;
    theKey->fCreationStatus = status;
    if (value->softRefCount == 0) {
        _registerMaster(theKey, value);
    }
    value->softRefCount++;
    UHashElement *ptr = const_cast<UHashElement *>(element);
    ptr->value.pointer = (void *) value;
    U_ASSERT(oldValue == fNoValue);
    removeSoftRef(oldValue);

    // Tell waiting threads that we replace in-progress status with
    // an error.
    umtx_condBroadcast(&gInProgressValueAddedCond);
}